

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetIntegerVerifier::verifyStencilMaskInitial
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,int stencilBits)

{
  ostringstream *this_00;
  bool bVar1;
  uint uVar2;
  StateQueryMemoryWriteGuard<int> state;
  StateQueryMemoryWriteGuard<int> local_1a4;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_1a4.m_preguard = -0x21212122;
  local_1a4.m_value = -0x21212122;
  local_1a4.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&local_1a4.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_1a4,testCtx);
  if ((bVar1) &&
     (uVar2 = -1 << ((byte)stencilBits & 0x1f), (local_1a4.m_value | uVar2) != 0xffffffff)) {
    local_198._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected minimum mask of ",0x23);
    std::ostream::operator<<(this_00,~uVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; got ",6);
    std::ostream::operator<<(this_00,local_1a4.m_value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid mask value");
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyStencilMaskInitial (tcu::TestContext& testCtx, GLenum name, int stencilBits)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint> state;
	glGetIntegerv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	const GLint reference = (1 << stencilBits) - 1;

	if ((state & reference) != reference) // the least significant stencilBits bits should be on
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected minimum mask of " << reference << "; got " << state << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid mask value");
	}
}